

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_s_rxr_shr(DisasContext_conflict1 *s,arg_s_rrr_shr *a,VFPGen2OpSPFn_conflict *gen,
                  int logic_cc,StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 shift;
  TCGv_i32 var;
  
  tcg_ctx = s->uc->tcg_ctx;
  shift = load_reg(s,a->rs);
  var = load_reg(s,a->rm);
  gen_arm_shift_reg(tcg_ctx,var,a->shty,shift,logic_cc);
  (*gen)(tcg_ctx,var,var);
  if (logic_cc != 0) {
    gen_logic_CC(tcg_ctx,var);
  }
  _Var1 = store_reg_kind(s,a->rd,var,kind);
  return _Var1;
}

Assistant:

static bool op_s_rxr_shr(DisasContext *s, arg_s_rrr_shr *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp1 = load_reg(s, a->rs);
    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_reg(tcg_ctx, tmp2, a->shty, tmp1, logic_cc);

    gen(tcg_ctx, tmp2, tmp2);
    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp2);
    }
    return store_reg_kind(s, a->rd, tmp2, kind);
}